

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_read_scatter_single(char *prefix,kvtree *data)

{
  int iVar1;
  char *pcVar2;
  DIR *__dirp;
  dirent *pdVar3;
  kvtree *hash2;
  kvtree *subfile_rank_tree;
  unsigned_long level;
  kvtree *subfile_tree;
  char tmp [4096];
  dirent *dir;
  unsigned_long actual_ranks;
  DIR *d;
  regex_t regex;
  char pattern [4096];
  char *prefix_file;
  char *prefix_file_copy;
  char *prefix_dir;
  char *prefix_dir_copy;
  unsigned_long expected_ranks;
  kvtree *pkStack_28;
  int rc;
  kvtree *final_tree;
  kvtree *data_local;
  char *prefix_local;
  
  final_tree = data;
  data_local = (kvtree *)prefix;
  pkStack_28 = kvtree_new();
  expected_ranks._4_4_ = kvtree_read_file((char *)data_local,pkStack_28);
  if (expected_ranks._4_4_ == 0) {
    expected_ranks._4_4_ =
         kvtree_util_get_unsigned_long(pkStack_28,"RANKS",(unsigned_long *)&prefix_dir_copy);
    if (expected_ranks._4_4_ == 0) {
      kvtree_delete(&stack0xffffffffffffffd8);
      pkStack_28 = kvtree_new();
      prefix_dir = strdup((char *)data_local);
      prefix_file_copy = dirname(prefix_dir);
      prefix_file = strdup((char *)data_local);
      pcVar2 = __xpg_basename(prefix_file);
      snprintf(&regex.field_0x38,0x1000,"^%s\\.0\\.[0-9]+$",pcVar2);
      expected_ranks._4_4_ = regcomp((regex_t *)&d,&regex.field_0x38,1);
      if (expected_ranks._4_4_ == 0) {
        __dirp = opendir(prefix_file_copy);
        if (__dirp == (DIR *)0x0) {
          expected_ranks._4_4_ = 1;
        }
        else {
          dir = (dirent *)0x0;
          while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
            expected_ranks._4_4_ = regexec((regex_t *)&d,pdVar3->d_name,0,(regmatch_t *)0x0,0);
            if (expected_ranks._4_4_ == 0) {
              memset(&subfile_tree,0,0x1000);
              snprintf((char *)&subfile_tree,0x1000,"%s/%s",prefix_file_copy);
              tmp[0xff7] = '\0';
              level = (unsigned_long)kvtree_new();
              expected_ranks._4_4_ = kvtree_read_file((char *)&subfile_tree,(kvtree *)level);
              if ((((expected_ranks._4_4_ == 0) &&
                   (expected_ranks._4_4_ =
                         kvtree_util_get_unsigned_long
                                   ((kvtree *)level,"LEVEL",(unsigned_long *)&subfile_rank_tree),
                   expected_ranks._4_4_ == 0)) && (subfile_rank_tree == (kvtree *)0x0)) &&
                 ((hash2 = kvtree_extract((kvtree *)level,"RANK"), hash2 != (kvtree *)0x0 &&
                  (iVar1 = kvtree_merge(pkStack_28,hash2), iVar1 == 0)))) {
                iVar1 = kvtree_size(hash2);
                dir = (dirent *)(dir->d_name + (long)iVar1 + -0x13);
              }
              kvtree_delete((kvtree **)&level);
            }
          }
          closedir(__dirp);
          kvtree_merge(final_tree,pkStack_28);
          expected_ranks._4_4_ = 0;
        }
      }
      else {
        expected_ranks._4_4_ = 1;
      }
      kvtree_free(&prefix_dir);
      kvtree_free(&prefix_file);
      kvtree_delete(&stack0xffffffffffffffd8);
      if ((expected_ranks._4_4_ == 0) && (dir == (dirent *)prefix_dir_copy)) {
        prefix_local._4_4_ = 0;
      }
      else {
        prefix_local._4_4_ = 1;
      }
    }
    else {
      kvtree_delete(&stack0xffffffffffffffd8);
      kvtree_err("Couldn\'t get RANKS for %s\n",data_local);
      prefix_local._4_4_ = expected_ranks._4_4_;
    }
  }
  else {
    kvtree_delete(&stack0xffffffffffffffd8);
    kvtree_err("Couldn\'t read in high level kvtree file %s\n",data_local);
    prefix_local._4_4_ = expected_ranks._4_4_;
  }
  return prefix_local._4_4_;
}

Assistant:

int kvtree_read_scatter_single(const char* prefix, kvtree* data)
{
  /*
   * Read in high level kvtree.
   */
  kvtree* final_tree = kvtree_new();
  int rc = kvtree_read_file(prefix, final_tree);
  if (rc != KVTREE_SUCCESS) {
    kvtree_delete(&final_tree);
    kvtree_err("Couldn't read in high level kvtree file %s\n", prefix);
    return rc;
  }

  unsigned long expected_ranks;
  rc = kvtree_util_get_unsigned_long(final_tree, "RANKS", &expected_ranks);
  if (rc != KVTREE_SUCCESS) {
    kvtree_delete(&final_tree);
    kvtree_err("Couldn't get RANKS for %s\n", prefix);
    return rc;
  }
  kvtree_delete(&final_tree);

  /* Start construction of the final tree that we will return */
  final_tree = kvtree_new();

  /* Look at all the subfiles with our prefix and read in the file lists */
  char* prefix_dir_copy = strdup(prefix);
  char* prefix_dir = dirname(prefix_dir_copy);
  char* prefix_file_copy = strdup(prefix);
  char* prefix_file = basename(prefix_file_copy);

  /* Create our regex to match our prefix files */
  char pattern[PATH_MAX];
  snprintf(pattern, sizeof(pattern), "^%s\\.0\\.[0-9]+$", prefix_file);
  pattern[sizeof(pattern) - 1] = '\0';

  regex_t regex;
  rc = regcomp(&regex, pattern, REG_EXTENDED);
  if (rc) {
    rc = KVTREE_FAILURE;
    goto end;
  }

  DIR* d = opendir(prefix_dir);
  if (!d) {
    rc = KVTREE_FAILURE;
    goto end;
  }

  /* For each file/dir in our prefix dir */
  unsigned long actual_ranks = 0;
  struct dirent* dir;
  while ((dir = readdir(d)) != NULL) {
    /*
     * Search for any file starting with "prefix_file."
     * like "rank2file.".
     */
    /* Is this one of our subfiles?  It should have .0.x in the extension */
    rc = regexec(&regex, dir->d_name, 0, NULL, 0);
    if (rc == 0) {  /* Did we get both numbers in the extension? */
      /* subfile matches */

      /* Construct the full path to the subfile kvtree */
      char tmp[PATH_MAX];
      memset(tmp, 0, sizeof(tmp));
      snprintf(tmp, sizeof(tmp), "%s/%s", prefix_dir, dir->d_name);
      tmp[sizeof(tmp) - 1] = '\0';

      /* Read in the subfile */
      kvtree* subfile_tree = kvtree_new();
      rc = kvtree_read_file(tmp, subfile_tree);
      if (rc == KVTREE_SUCCESS) {
        /* Sanity: each subfile we want will have LEVEL=0 */
        unsigned long level;
        rc = kvtree_util_get_unsigned_long(subfile_tree, "LEVEL", &level);
        if (rc == KVTREE_SUCCESS && level == 0) {
          /* Break off and remove the "RANK" subtree from the rank2file tree */
          kvtree* subfile_rank_tree = kvtree_extract(subfile_tree, "RANK");
          if (subfile_rank_tree) {
            if (kvtree_merge(final_tree, subfile_rank_tree) == KVTREE_SUCCESS) {
              actual_ranks += kvtree_size(subfile_rank_tree);
            }
          }
        }
      }
      kvtree_delete(&subfile_tree);
    }
  }
  closedir(d);
  kvtree_merge(data, final_tree);
  rc = KVTREE_SUCCESS;

end:
  kvtree_free(&prefix_dir_copy);
  kvtree_free(&prefix_file_copy);
  kvtree_delete(&final_tree);
  if (rc != KVTREE_SUCCESS || actual_ranks != expected_ranks) {
    return KVTREE_FAILURE;
  }

  return KVTREE_SUCCESS;
}